

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceMapSerializeTest_MapRoundTripNonZeroKeyNonZeroMessage_Test<absl::lts_20250127::Cord>
::TestBody(NoFieldPresenceMapSerializeTest_MapRoundTripNonZeroKeyNonZeroMessage_Test<absl::lts_20250127::Cord>
           *this)

{
  MapField<proto2_nofieldpresence_unittest::TestAllMapTypes_MapInt32ForeignMessageEntry_DoNotUse,_int,_proto2_nofieldpresence_unittest::ForeignMessage,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  *this_00;
  MapField<proto2_nofieldpresence_unittest::TestAllMapTypes_MapInt32ForeignMessageEntry_DoNotUse,_int,_proto2_nofieldpresence_unittest::ForeignMessage,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  *this_01;
  anon_union_32_1_898eb381_for_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignMessage>_3
  *this_02;
  bool bVar1;
  Map<int,_proto2_nofieldpresence_unittest::ForeignMessage> *this_03;
  ForeignMessage *pFVar2;
  char *pcVar3;
  char *in_R9;
  Cord *output;
  string_view data;
  AssertHelper local_210;
  AssertionResult gtest_ar__2;
  AssertHelper local_1f8;
  AssertionResult gtest_ar_;
  key_arg<int> local_1cc;
  TestAllMapTypes rt_msg;
  TestAllMapTypes msg;
  
  proto2_nofieldpresence_unittest::TestAllMapTypes::TestAllMapTypes(&msg);
  this_00 = &msg.field_0._impl_.map_int32_foreign_message_;
  this_03 = internal::TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignMessage>
            ::MutableMap(&this_00->
                          super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignMessage>
                        );
  rt_msg.super_Message.super_MessageLite._vptr_MessageLite._0_4_ = 0x7b;
  pFVar2 = Map<int,_proto2_nofieldpresence_unittest::ForeignMessage>::operator[]<int>
                     (this_03,(key_arg<int> *)&rt_msg);
  (pFVar2->field_0)._impl_.c_ = 0x2775;
  *(byte *)&pFVar2->field_0 = *(byte *)&pFVar2->field_0 | 1;
  output = &(this->super_NoFieldPresenceMapSerializeTest<absl::lts_20250127::Cord>).value_;
  gtest_ar_.success_ = MessageLite::SerializeToString((MessageLite *)&msg,output);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (gtest_ar_.success_) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    absl::lts_20250127::Cord::operator_cast_to_string((string *)&rt_msg,output);
    gtest_ar_.success_ = rt_msg.super_Message.super_MessageLite._internal_metadata_.ptr_ != 0;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    std::__cxx11::string::~string((string *)&rt_msg);
    if (gtest_ar_.success_ != false) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      proto2_nofieldpresence_unittest::TestAllMapTypes::TestAllMapTypes(&rt_msg);
      absl::lts_20250127::Cord::operator_cast_to_string((string *)&gtest_ar_,output);
      data._M_str._1_7_ = gtest_ar_._1_7_;
      data._M_str._0_1_ = gtest_ar_.success_;
      data._M_len = (size_t)gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      bVar1 = MessageLite::ParseFromString((MessageLite *)&rt_msg,data);
      gtest_ar__2.success_ = bVar1;
      gtest_ar__2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      std::__cxx11::string::~string((string *)&gtest_ar_);
      if (gtest_ar__2.success_ == false) {
        testing::Message::Message((Message *)&local_210);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__2,
                   (AssertionResult *)"rt_msg.ParseFromString(this->GetOutput())","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1f8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                   ,0x355,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
        testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&local_210);
        testing::internal::AssertHelper::~AssertHelper(&local_1f8);
        std::__cxx11::string::~string((string *)&gtest_ar_);
        if ((long *)CONCAT44(local_210.data_._4_4_,(int32_t)local_210.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_210.data_._4_4_,(int32_t)local_210.data_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__2.message_);
      this_01 = &rt_msg.field_0._impl_.map_int32_foreign_message_;
      internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)this_01);
      this_02 = &rt_msg.field_0._impl_.map_int32_foreign_message_.
                 super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignMessage>
                 .field_0;
      local_210.data_._0_4_ = 0x7b;
      pFVar2 = Map<int,_proto2_nofieldpresence_unittest::ForeignMessage>::at<int>
                         (&this_02->map_,(key_arg<int> *)&local_210);
      gtest_ar__2._0_4_ = (pFVar2->field_0)._impl_.c_;
      internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)this_00);
      local_1cc = 0x7b;
      pFVar2 = Map<int,_proto2_nofieldpresence_unittest::ForeignMessage>::at<int>
                         (&msg.field_0._impl_.map_int32_foreign_message_.
                           super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignMessage>
                           .field_0.map_,&local_1cc);
      local_1f8.data_._0_4_ = (pFVar2->field_0)._impl_.c_;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar_,"rt_msg.map_int32_foreign_message().at(123).c()",
                 "msg.map_int32_foreign_message().at(123).c()",(int *)&gtest_ar__2,(int *)&local_1f8
                );
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__2);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar3 = anon_var_dwarf_651463 + 5;
        }
        else {
          pcVar3 = *(char **)gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_210,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                   ,0x358,pcVar3);
        testing::internal::AssertHelper::operator=(&local_210,(Message *)&gtest_ar__2);
        testing::internal::AssertHelper::~AssertHelper(&local_210);
        if ((long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      gtest_ar__2.success_ = true;
      gtest_ar__2._1_3_ = 0x27;
      internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)this_01);
      local_1f8.data_._0_4_ = 0x7b;
      pFVar2 = Map<int,_proto2_nofieldpresence_unittest::ForeignMessage>::at<int>
                         (&this_02->map_,(key_arg<int> *)&local_1f8);
      local_210.data_._0_4_ = (pFVar2->field_0)._impl_.c_;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar_,"10101","rt_msg.map_int32_foreign_message().at(123).c()",
                 (int *)&gtest_ar__2,(int *)&local_210);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__2);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar3 = anon_var_dwarf_651463 + 5;
        }
        else {
          pcVar3 = *(char **)gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_210,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                   ,0x35c,pcVar3);
        testing::internal::AssertHelper::operator=(&local_210,(Message *)&gtest_ar__2);
        testing::internal::AssertHelper::~AssertHelper(&local_210);
        if ((long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      proto2_nofieldpresence_unittest::TestAllMapTypes::~TestAllMapTypes(&rt_msg);
      goto LAB_006e4baf;
    }
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&rt_msg,(internal *)&gtest_ar_,
               (AssertionResult *)"this->GetOutput().empty()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x351,(char *)CONCAT44(rt_msg.super_Message.super_MessageLite._vptr_MessageLite.
                                       _4_4_,rt_msg.super_Message.super_MessageLite.
                                             _vptr_MessageLite._0_4_));
    testing::internal::AssertHelper::operator=(&local_210,(Message *)&gtest_ar__2);
  }
  else {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&rt_msg,(internal *)&gtest_ar_,
               (AssertionResult *)"TestSerialize(msg, &output_sink)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x34f,(char *)CONCAT44(rt_msg.super_Message.super_MessageLite._vptr_MessageLite.
                                       _4_4_,rt_msg.super_Message.super_MessageLite.
                                             _vptr_MessageLite._0_4_));
    testing::internal::AssertHelper::operator=(&local_210,(Message *)&gtest_ar__2);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_210);
  std::__cxx11::string::~string((string *)&rt_msg);
  if ((long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
LAB_006e4baf:
  proto2_nofieldpresence_unittest::TestAllMapTypes::~TestAllMapTypes(&msg);
  return;
}

Assistant:

TYPED_TEST(NoFieldPresenceMapSerializeTest,
           MapRoundTripNonZeroKeyNonZeroMessage) {
  TestAllMapTypes msg;
  (*msg.mutable_map_int32_foreign_message())[123].set_c(10101);

  // Test that message can serialize.
  TypeParam& output_sink = this->GetOutputSinkRef();
  ASSERT_TRUE(TestSerialize(msg, &output_sink));
  // Maps with zero key or value fields are still serialized.
  ASSERT_FALSE(this->GetOutput().empty());

  // Test that message can roundtrip.
  TestAllMapTypes rt_msg;
  EXPECT_TRUE(rt_msg.ParseFromString(this->GetOutput()));
  // TODO: b/368089585 - write this better when we have access to EqualsProto.
  EXPECT_EQ(rt_msg.map_int32_foreign_message().at(123).c(),
            msg.map_int32_foreign_message().at(123).c());

  // The map behaviour is pretty much the same whether the key/value field is
  // zero or not.
  EXPECT_EQ(10101, rt_msg.map_int32_foreign_message().at(123).c());
}